

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O3

void ares_process_pending_write(ares_channel_t *channel)

{
  ares_conn_t *conn;
  ares_status_t requeue_status;
  ares_slist_node_t *node;
  void *pvVar1;
  
  if (channel != (ares_channel_t *)0x0) {
    ares_channel_lock(channel);
    if (channel->notify_pending_write != ARES_FALSE) {
      channel->notify_pending_write = ARES_FALSE;
      for (node = ares_slist_node_first(channel->servers); node != (ares_slist_node_t *)0x0;
          node = ares_slist_node_next(node)) {
        pvVar1 = ares_slist_node_val(node);
        conn = *(ares_conn_t **)((long)pvVar1 + 0x80);
        if ((conn != (ares_conn_t *)0x0) &&
           (requeue_status = ares_conn_flush(conn), requeue_status != ARES_SUCCESS)) {
          server_increment_failures(conn->server,conn->flags & ARES_TRUE);
          ares_close_connection(conn,requeue_status);
        }
      }
    }
    ares_channel_unlock(channel);
    return;
  }
  return;
}

Assistant:

void ares_process_pending_write(ares_channel_t *channel)
{
  ares_slist_node_t *node;

  if (channel == NULL) {
    return;
  }

  ares_channel_lock(channel);
  if (!channel->notify_pending_write) {
    ares_channel_unlock(channel);
    return;
  }

  /* Set as untriggerd before calling into ares_conn_flush(), this is
   * because its possible ares_conn_flush() might cause additional data to
   * be enqueued if there is some form of exception so it will need to recurse.
   */
  channel->notify_pending_write = ARES_FALSE;

  for (node = ares_slist_node_first(channel->servers); node != NULL;
       node = ares_slist_node_next(node)) {
    ares_server_t *server = ares_slist_node_val(node);
    ares_conn_t   *conn   = server->tcp_conn;
    ares_status_t  status;

    if (conn == NULL) {
      continue;
    }

    /* Enqueue any pending data if there is any */
    status = ares_conn_flush(conn);
    if (status != ARES_SUCCESS) {
      handle_conn_error(conn, ARES_TRUE, status);
    }
  }

  ares_channel_unlock(channel);
}